

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O2

RefcountedRep * absl::crc_internal::CrcCordState::RefSharedEmptyRep(void)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (RefSharedEmptyRep()::empty == '\0') {
    iVar1 = __cxa_guard_acquire(&RefSharedEmptyRep()::empty);
    if (iVar1 != 0) {
      NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::PlacementImpl::PlacementImpl<>
                (&RefSharedEmptyRep::empty.impl_);
      __cxa_guard_release(&RefSharedEmptyRep()::empty);
    }
  }
  if ((int)RefSharedEmptyRep::empty.impl_.space_._0_4_ < 1) {
    __assertion = "empty->count.load(std::memory_order_relaxed) >= 1";
    __line = 0x1e;
  }
  else if (RefSharedEmptyRep::empty.impl_.space_._8_8_ == 0) {
    if (RefSharedEmptyRep::empty.impl_.space_._72_8_ == RefSharedEmptyRep::empty.impl_.space_._40_8_
       ) {
      LOCK();
      RefSharedEmptyRep::empty.impl_.space_._0_4_ = RefSharedEmptyRep::empty.impl_.space_._0_4_ + 1;
      UNLOCK();
      return (RefcountedRep *)&RefSharedEmptyRep::empty;
    }
    __assertion = "empty->rep.prefix_crc.empty()";
    __line = 0x20;
  }
  else {
    __assertion = "empty->rep.removed_prefix.length == 0";
    __line = 0x1f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/crc/internal/crc_cord_state.cc"
                ,__line,
                "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
               );
}

Assistant:

CrcCordState::RefcountedRep* CrcCordState::RefSharedEmptyRep() {
  static absl::NoDestructor<CrcCordState::RefcountedRep> empty;

  assert(empty->count.load(std::memory_order_relaxed) >= 1);
  assert(empty->rep.removed_prefix.length == 0);
  assert(empty->rep.prefix_crc.empty());

  Ref(empty.get());
  return empty.get();
}